

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_digests.c
# Opt level: O0

int lookup(h2o_cache_digests_frame_vector_t *vector,char *url,size_t url_len,char *etag,
          size_t etag_len,int is_fresh,int is_complete)

{
  void *pvVar1;
  ulong local_60;
  uint64_t key;
  h2o_cache_digests_frame_t *frame;
  size_t i;
  uint64_t hash;
  size_t sStack_38;
  int is_fresh_local;
  size_t etag_len_local;
  char *etag_local;
  size_t url_len_local;
  char *url_local;
  h2o_cache_digests_frame_vector_t *vector_local;
  
  if (vector->size != 0) {
    hash._4_4_ = is_fresh;
    sStack_38 = etag_len;
    etag_len_local = (size_t)etag;
    etag_local = (char *)url_len;
    url_len_local = (size_t)url;
    url_local = (char *)vector;
    i = calc_hash(url,url_len,etag,etag_len);
    frame = (h2o_cache_digests_frame_t *)0x0;
    do {
      key = *(long *)url_local + (long)frame * 0x20;
      local_60 = i >> (0x40U - (char)(int)*(long *)(key + 0x18) & 0x3f);
      if ((*(long *)key != 0) &&
         (pvVar1 = bsearch(&local_60,*(void **)key,*(size_t *)(key + 8),8,cmp_key),
         pvVar1 != (void *)0x0)) {
        if (hash._4_4_ == 0) {
          return 3;
        }
        return 2;
      }
      frame = (h2o_cache_digests_frame_t *)((long)&(frame->keys).entries + 1);
    } while (frame != *(h2o_cache_digests_frame_t **)(url_local + 8));
  }
  return (uint)(is_complete != 0);
}

Assistant:

static int lookup(h2o_cache_digests_frame_vector_t *vector, const char *url, size_t url_len, const char *etag, size_t etag_len,
                  int is_fresh, int is_complete)
{
    if (vector->size != 0) {
        uint64_t hash = calc_hash(url, url_len, etag, etag_len);
        size_t i = 0;
        do {
            h2o_cache_digests_frame_t *frame = vector->entries + i;
            uint64_t key = hash >> (64 - frame->capacity_bits);
            if (frame->keys.entries != NULL &&
                bsearch(&key, frame->keys.entries, frame->keys.size, sizeof(frame->keys.entries[0]), cmp_key) != NULL)
                return is_fresh ? H2O_CACHE_DIGESTS_STATE_FRESH : H2O_CACHE_DIGESTS_STATE_STALE;
        } while (++i != vector->size);
    }

    return is_complete ? H2O_CACHE_DIGESTS_STATE_NOT_CACHED : H2O_CACHE_DIGESTS_STATE_UNKNOWN;
}